

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint id;
  int in_EAX;
  TheoryTerm *pTVar1;
  Data *pDVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  long lVar4;
  
  uVar3 = *(uint *)CONCAT44(in_register_00000034,__fd) & 0x7fffffff;
  if (uVar3 != 0) {
    lVar4 = 0;
    do {
      id = *(uint *)((long)CONCAT44(in_register_00000034,__fd) + lVar4 + 4);
      if (((int)__addr_len == 0) ||
         (((pDVar2 = this->data_, id < (uint)((pDVar2->terms).top >> 3) &&
           (*(long *)((long)(pDVar2->terms).mem.beg_ + (ulong)id * 8) != -1)) &&
          ((pDVar2->frame).term <= id)))) {
        pTVar1 = getTerm(this,id);
        pDVar2 = (Data *)(**(code **)(*(long *)__addr + 0x10))(__addr,this,(ulong)id,pTVar1);
      }
      in_EAX = (int)pDVar2;
      lVar4 = lVar4 + 4;
    } while ((ulong)uVar3 << 2 != lVar4);
  }
  return in_EAX;
}

Assistant:

void TheoryData::accept(const TheoryElement& e, Visitor& out, VisitMode m) const {
	for (TheoryElement::iterator it = e.begin(), end = e.end(); it != end; ++it) {
		if (doVisitTerm(m, *it)) { out.visit(*this, *it, getTerm(*it)); }
	}
}